

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-handles.c
# Opt level: O3

void prepare_2_cb(uv_prepare_t *handle)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  fputs("PREPARE_2_CB\n",_stderr);
  fflush(_stderr);
  if (handle == &prepare_2_handle) {
    if (((byte)loop_iteration & 1) == 0) {
      pcVar3 = "loop_iteration % 2 != 0";
      uVar2 = 0xfd;
    }
    else {
      iVar1 = uv_prepare_stop(&prepare_2_handle);
      if (iVar1 == 0) {
        prepare_2_cb_called = prepare_2_cb_called + 1;
        return;
      }
      pcVar3 = "r == 0";
      uVar2 = 0x100;
    }
  }
  else {
    pcVar3 = "handle == &prepare_2_handle";
    uVar2 = 0xf7;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-handles.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void prepare_2_cb(uv_prepare_t* handle) {
  int r;

  fprintf(stderr, "%s", "PREPARE_2_CB\n");
  fflush(stderr);
  ASSERT(handle == &prepare_2_handle);

  /* Prepare_2 gets started by prepare_1 when (loop_iteration % 2 == 0), and it
   * stops itself immediately. A started watcher is not queued until the next
   * round, so when this callback is made (loop_iteration % 2 == 0) cannot be
   * true. */
  ASSERT(loop_iteration % 2 != 0);

  r = uv_prepare_stop((uv_prepare_t*)handle);
  ASSERT(r == 0);

  prepare_2_cb_called++;
}